

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O0

void __thiscall SqlGenerator::generateAggregateQueries(SqlGenerator *this)

{
  undefined8 uVar1;
  bool bVar2;
  element_type *peVar3;
  size_t sVar4;
  TDNode *pTVar5;
  ulong uVar6;
  size_type sVar7;
  reference ppAVar8;
  reference pvVar9;
  pointer ppVar10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar13;
  size_t i_3;
  size_t i_2;
  string groupByString;
  size_t f_1;
  string prodString_1;
  prod_bitset prod_1;
  size_t i_1;
  string sumString_1;
  size_t aggIdx_1;
  Aggregate *aggregate_1;
  size_t agg_1;
  string aggregateString_1;
  size_t var_1;
  string fVarString_1;
  Query *query_1;
  size_t queryID_1;
  size_t aggID_unmerged;
  size_t var;
  string fVarString;
  pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *fvarAggPair;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  size_t aggID;
  ofstream ofs;
  pair<std::__detail::_Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  it_pair;
  size_t f;
  string prodString;
  prod_bitset prod;
  size_t i;
  string sumString;
  size_t aggIdx;
  Aggregate *aggregate;
  size_t agg;
  string aggregateString;
  Query *query;
  size_t queryID;
  size_t aggNum;
  unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fVarAggregateMap;
  size_t rel;
  string attributeString;
  string joinString;
  unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff238;
  TreeDecomposition *in_stack_fffffffffffff240;
  value_type *in_stack_fffffffffffff248;
  TreeDecomposition *in_stack_fffffffffffff250;
  Function *in_stack_fffffffffffff260;
  undefined7 in_stack_fffffffffffff268;
  undefined1 in_stack_fffffffffffff26f;
  pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff280;
  char *in_stack_fffffffffffff288;
  char *__lhs;
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  ulong local_c18;
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  ulong local_b90;
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  string local_b08 [32];
  string local_ae8 [32];
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [24];
  size_t in_stack_fffffffffffff5b0;
  SqlGenerator *in_stack_fffffffffffff5b8;
  undefined1 local_a21 [33];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  ulong local_900;
  undefined1 local_8f1 [33];
  undefined1 local_8d0 [192];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_810;
  undefined1 local_801 [33];
  size_type local_7e0;
  value_type local_7d8;
  char *local_7d0;
  allocator local_7c1;
  string local_7c0 [32];
  string local_7a0 [32];
  reference local_780;
  ulong local_770;
  allocator local_761;
  value_type local_760;
  ulong local_730;
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  ulong local_5e8;
  allocator local_5d9;
  string local_5d8 [32];
  reference local_5b8;
  _Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_5b0;
  _Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_5a8;
  undefined1 *local_5a0;
  ulong local_598;
  string local_590 [32];
  ostream local_570 [512];
  _Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_370;
  undefined1 local_368;
  _Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_330;
  undefined1 local_328;
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  ulong local_220;
  allocator local_211;
  string local_210 [32];
  undefined1 local_1f0 [192];
  ulong local_130;
  allocator local_121;
  string local_120 [32];
  size_type local_100;
  value_type local_f8;
  ulong local_f0;
  allocator local_e1;
  string local_e0 [32];
  Query *local_c0;
  ulong local_b8;
  long local_b0;
  undefined1 local_a8 [56];
  ulong local_70;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_70 = 0;
  while( true ) {
    uVar6 = local_70;
    peVar3 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3117cc);
    sVar4 = TreeDecomposition::numberOfRelations(peVar3);
    if (sVar4 <= uVar6) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x311808);
    pTVar5 = TreeDecomposition::getRelation
                       (in_stack_fffffffffffff240,(size_t)in_stack_fffffffffffff238);
    std::__cxx11::string::operator+=(local_28,(string *)pTVar5);
    uVar6 = local_70 + 1;
    peVar3 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x31185d);
    sVar4 = TreeDecomposition::numberOfRelations(peVar3);
    if (uVar6 < sVar4) {
      std::__cxx11::string::operator+=(local_28," NATURAL JOIN ");
    }
    local_70 = local_70 + 1;
  }
  std::
  unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x311929);
  local_b0 = 0;
  local_b8 = 0;
  while( true ) {
    uVar6 = local_b8;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x311962);
    sVar4 = QueryCompiler::numberOfQueries((QueryCompiler *)0x31196a);
    if (sVar4 <= uVar6) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x31199e);
    local_c0 = QueryCompiler::getQuery
                         ((QueryCompiler *)in_stack_fffffffffffff240,
                          (size_t)in_stack_fffffffffffff238);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"",&local_e1);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    for (local_f0 = 0; uVar6 = local_f0,
        sVar7 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size(&local_c0->_aggregates)
        , uVar6 < sVar7; local_f0 = local_f0 + 1) {
      ppAVar8 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_c0->_aggregates,local_f0);
      local_f8 = *ppAVar8;
      local_100 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"",&local_121);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      for (local_130 = 0; uVar6 = local_130,
          sVar7 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                            (&local_f8->_agg), uVar6 < sVar7; local_130 = local_130 + 1) {
        pvVar9 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                           (&local_f8->_agg,local_100);
        memcpy(local_1f0,pvVar9,0xc0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,"",&local_211);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
        for (local_220 = 0; local_220 < 0x5dc; local_220 = local_220 + 1) {
          bVar2 = std::bitset<1500UL>::test
                            ((bitset<1500UL> *)in_stack_fffffffffffff240,
                             (size_t)in_stack_fffffffffffff238);
          if (bVar2) {
            getFunctionString_abi_cxx11_(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
            std::__cxx11::string::operator+=(local_210,local_240);
            std::__cxx11::string::~string(local_240);
            std::__cxx11::string::~string(local_260);
          }
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::__cxx11::string::pop_back();
        }
        else {
          std::__cxx11::string::operator+=(local_210,"1");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                       (char *)in_stack_fffffffffffff260);
        std::__cxx11::string::operator+=(local_120,local_280);
        std::__cxx11::string::~string(local_280);
        local_100 = local_100 + 1;
        std::__cxx11::string::~string(local_210);
      }
      std::__cxx11::string::pop_back();
      std::operator+(in_stack_fffffffffffff288,in_stack_fffffffffffff280);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
      local_b0 = local_b0 + 1;
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff278);
      std::operator+(in_stack_fffffffffffff278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff270);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
      std::__cxx11::string::operator+=(local_e0,local_2a0);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::~string(local_120);
    }
    std::
    pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::bitset<100UL>_&,_const_char_(&)[1],_true>
              (in_stack_fffffffffffff270,
               (bitset<100UL> *)CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
               (char (*) [1])in_stack_fffffffffffff260);
    pVar13 = std::
             unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::insert((unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
    local_370._M_cur =
         (__node_type *)
         pVar13.first.
         super__Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
         ._M_cur;
    local_368 = pVar13.second;
    local_330._M_cur = local_370._M_cur;
    local_328 = local_368;
    std::
    pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x3120ab);
    ppVar10 = std::__detail::
              _Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
              ::operator->((_Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                            *)0x3120b8);
    std::__cxx11::string::operator+=((string *)&ppVar10->second,local_e0);
    std::__cxx11::string::~string(local_e0);
    local_b8 = local_b8 + 1;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                 (char *)in_stack_fffffffffffff260);
  std::ofstream::ofstream(local_570,local_590,_S_out);
  std::__cxx11::string::~string(local_590);
  local_598 = 0;
  local_5a0 = local_a8;
  local_5a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_fffffffffffff238);
  local_5b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffff238);
  while (bVar2 = std::__detail::operator!=(&local_5a8,&local_5b0), bVar2) {
    local_5b8 = std::__detail::
                _Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                ::operator*((_Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                             *)0x3121f4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5d8,"",&local_5d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    for (local_5e8 = 0; local_5e8 < 100; local_5e8 = local_5e8 + 1) {
      bVar2 = std::bitset<100UL>::operator[]
                        ((bitset<100UL> *)in_stack_fffffffffffff240,
                         (size_t)in_stack_fffffffffffff238);
      if (bVar2) {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x312296);
        TreeDecomposition::getAttribute(in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                       (char *)in_stack_fffffffffffff260);
        std::__cxx11::string::operator+=(local_5d8,local_608);
        std::__cxx11::string::~string(local_608);
      }
    }
    std::__cxx11::string::pop_back();
    local_598 = local_598 + 1;
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff278);
    std::operator+((char *)in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator<<(local_570,local_628);
    std::__cxx11::string::~string(local_628);
    std::__cxx11::string::~string(local_648);
    std::__cxx11::string::~string(local_668);
    std::__cxx11::string::~string(local_688);
    std::__cxx11::string::~string(local_6a8);
    std::__cxx11::string::~string(local_6c8);
    std::__cxx11::string::~string(local_6e8);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::pop_back();
      std::operator+(in_stack_fffffffffffff288,in_stack_fffffffffffff280);
      std::operator<<(local_570,local_708);
      std::__cxx11::string::~string(local_708);
    }
    std::operator<<(local_570,");\n\n");
    std::__cxx11::string::~string(local_5d8);
    std::__detail::
    _Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  *)in_stack_fffffffffffff240);
  }
  std::ofstream::close();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                 (char *)in_stack_fffffffffffff260);
  std::ofstream::open((string *)local_570,(_Ios_Openmode)local_728);
  std::__cxx11::string::~string(local_728);
  local_730 = 0;
  local_760.second.field_2._8_8_ = 0;
  while( true ) {
    uVar1 = local_760.second.field_2._8_8_;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x31276b);
    sVar4 = QueryCompiler::numberOfQueries((QueryCompiler *)0x312773);
    if (sVar4 <= (ulong)uVar1) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3127a7);
    local_760.second.field_2._M_allocated_capacity =
         (size_type)
         QueryCompiler::getQuery
                   ((QueryCompiler *)in_stack_fffffffffffff240,(size_t)in_stack_fffffffffffff238);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_760,"",&local_761);
    std::allocator<char>::~allocator((allocator<char> *)&local_761);
    for (local_770 = 0; local_770 < 100; local_770 = local_770 + 1) {
      std::bitset<100UL>::operator[]
                (&in_stack_fffffffffffff248->first,(size_t)in_stack_fffffffffffff240);
      bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff240);
      std::bitset<100UL>::reference::~reference(&local_780);
      if (bVar2) {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x31287f);
        TreeDecomposition::getAttribute(in_stack_fffffffffffff250,(size_t)in_stack_fffffffffffff248)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                       (char *)in_stack_fffffffffffff260);
        std::__cxx11::string::operator+=((string *)&local_760,local_7a0);
        std::__cxx11::string::~string(local_7a0);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7c0,"",&local_7c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
    local_7d0 = (char *)0x0;
    while (__lhs = local_7d0,
          pcVar11 = (char *)std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size
                                      ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                                       (local_760.second.field_2._M_allocated_capacity + 0x18)),
          __lhs < pcVar11) {
      ppAVar8 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                           (local_760.second.field_2._M_allocated_capacity + 0x18),
                           (size_type)local_7d0);
      local_7d8 = *ppAVar8;
      local_7e0 = 0;
      in_stack_fffffffffffff280 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_801;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_801 + 1),"",(allocator *)in_stack_fffffffffffff280);
      std::allocator<char>::~allocator((allocator<char> *)local_801);
      local_810 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      while (in_stack_fffffffffffff278 = local_810,
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                                (&local_7d8->_agg), in_stack_fffffffffffff278 < pbVar12) {
        pvVar9 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                           (&local_7d8->_agg,local_7e0);
        memcpy(local_8d0,pvVar9,0xc0);
        in_stack_fffffffffffff270 =
             (pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_8f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_8f1 + 1),"",(allocator *)in_stack_fffffffffffff270);
        std::allocator<char>::~allocator((allocator<char> *)local_8f1);
        for (local_900 = 0; local_900 < 0x5dc; local_900 = local_900 + 1) {
          in_stack_fffffffffffff26f =
               std::bitset<1500UL>::test
                         ((bitset<1500UL> *)in_stack_fffffffffffff240,
                          (size_t)in_stack_fffffffffffff238);
          if ((bool)in_stack_fffffffffffff26f) {
            std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x312b6e);
            in_stack_fffffffffffff260 =
                 QueryCompiler::getFunction
                           ((QueryCompiler *)in_stack_fffffffffffff240,
                            (size_t)in_stack_fffffffffffff238);
            if (in_stack_fffffffffffff260->_operation != dynamic) {
              getFunctionString_abi_cxx11_(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
              std::__cxx11::string::operator+=((string *)(local_8f1 + 1),local_920);
              std::__cxx11::string::~string(local_920);
              std::__cxx11::string::~string(local_940);
            }
          }
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::__cxx11::string::pop_back();
        }
        else {
          std::__cxx11::string::operator+=((string *)(local_8f1 + 1),"1");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                       (char *)in_stack_fffffffffffff260);
        std::__cxx11::string::operator+=((string *)(local_801 + 1),local_960);
        std::__cxx11::string::~string(local_960);
        local_7e0 = local_7e0 + 1;
        std::__cxx11::string::~string((string *)(local_8f1 + 1));
        local_810 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &local_810->field_0x1;
      }
      std::__cxx11::string::pop_back();
      std::operator+(__lhs,in_stack_fffffffffffff280);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff278);
      std::operator+(in_stack_fffffffffffff278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff270);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
      std::__cxx11::string::operator+=(local_7c0,local_980);
      std::__cxx11::string::~string(local_980);
      std::__cxx11::string::~string(local_9a0);
      std::__cxx11::string::~string(local_a00);
      std::__cxx11::string::~string(local_9c0);
      std::__cxx11::string::~string(local_9e0);
      std::__cxx11::string::~string((string *)(local_801 + 1));
      local_7d0 = local_7d0 + 1;
    }
    std::__cxx11::string::pop_back();
    in_stack_fffffffffffff250 = (TreeDecomposition *)local_a21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_a21 + 1),"",(allocator *)in_stack_fffffffffffff250);
    std::allocator<char>::~allocator((allocator<char> *)local_a21);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff260);
      in_stack_fffffffffffff240 = (TreeDecomposition *)&stack0xfffffffffffff5b8;
      std::__cxx11::string::operator=(local_7c0,(string *)in_stack_fffffffffffff240);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffff240);
      in_stack_fffffffffffff248 = &local_760;
      std::__cxx11::string::pop_back();
      std::operator+(__lhs,in_stack_fffffffffffff280);
      std::__cxx11::string::operator+=((string *)(local_a21 + 1),local_a68);
      std::__cxx11::string::~string(local_a68);
    }
    local_730 = local_730 + 1;
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff278);
    std::operator+((char *)in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
    std::operator<<(local_570,local_a88);
    std::__cxx11::string::~string(local_a88);
    std::__cxx11::string::~string(local_aa8);
    std::__cxx11::string::~string(local_ac8);
    std::__cxx11::string::~string(local_ae8);
    std::__cxx11::string::~string(local_b08);
    std::__cxx11::string::~string(local_b28);
    std::__cxx11::string::~string(local_b48);
    std::__cxx11::string::~string(local_b68);
    std::__cxx11::string::~string((string *)(local_a21 + 1));
    std::__cxx11::string::~string(local_7c0);
    std::__cxx11::string::~string((string *)&local_760);
    local_760.second.field_2._8_8_ = local_760.second.field_2._8_8_ + 1;
  }
  std::ofstream::close();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                 (char *)in_stack_fffffffffffff260);
  std::ofstream::open((string *)local_570,(_Ios_Openmode)local_b88);
  std::__cxx11::string::~string(local_b88);
  for (local_b90 = 0; local_b90 < local_598; local_b90 = local_b90 + 1) {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff278);
    std::operator+((char *)in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
    std::operator<<(local_570,local_bb0);
    std::__cxx11::string::~string(local_bb0);
    std::__cxx11::string::~string(local_bd0);
    std::__cxx11::string::~string(local_bf0);
  }
  std::ofstream::close();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                 (char *)in_stack_fffffffffffff260);
  std::ofstream::open((string *)local_570,(_Ios_Openmode)local_c10);
  std::__cxx11::string::~string(local_c10);
  for (local_c18 = 0; local_c18 < local_730; local_c18 = local_c18 + 1) {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff278);
    std::operator+((char *)in_stack_fffffffffffff248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff248,(char *)in_stack_fffffffffffff240);
    std::operator<<(local_570,local_c38);
    std::__cxx11::string::~string(local_c38);
    std::__cxx11::string::~string(local_c58);
    std::__cxx11::string::~string(local_c78);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_570);
  std::
  unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x3137bf);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void SqlGenerator::generateAggregateQueries()
{
    string joinString = "", attributeString  = "";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {    
        joinString += _td->getRelation(rel)->_name;
        if (rel + 1 < _td->numberOfRelations())
            joinString += " NATURAL JOIN ";
    }
    
    // for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    //     attributeString += _td->getAttribute(var)->_name + ",";
    // attributeString.pop_back();
    
    //********** TODO: TODO: ********** 
    // technically we need to join in the parameters
    // for now we just fix the params
    //********** TODO: TODO: **********
    // TODO: TODO: TODO: THIS SHOULD REALLY BE LINEARREGRESSION GRADIENT
    // TODO: TODO: TODO: Commenting out for now
    // if (false && _model == LinearRegressionModel)
    // {
    //     // Add parameters to the join string !
    //     var_bitset features = _app->getFeatures();

    //     const var_bitset categoricalFeatures =
    //         static_pointer_cast<LinearRegression>(_app)->
    //         getCategoricalFeatures();
        
    //     std::string catParams = "", contParams = "";
    //     for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    //     {
    //         if (features[var])
    //         {
    //             Attribute* attr = _td->getAttribute(var);

    //             if (categoricalFeatures[var])
    //                 catParams += " NATURAL JOIN "+attr->_name+"_param";
    //             else
    //                 contParams += ","+attr->_name+"_param";
    //         }
    //     }
        
    //     joinString += catParams + contParams;
    // }

    unordered_map<var_bitset,string> fVarAggregateMap;

    size_t aggNum = 0;
    
    for (size_t queryID = 0; queryID < _qc->numberOfQueries(); ++queryID)
    {
        Query* query = _qc->getQuery(queryID);
        
        std::string aggregateString = "";
        for (size_t agg = 0; agg < query->_aggregates.size(); ++agg)
        {
            Aggregate* aggregate = query->_aggregates[agg];
            
            size_t aggIdx = 0;

            string sumString = "";
            for (size_t i = 0; i < aggregate->_agg.size(); i++)
            {
                const prod_bitset prod = aggregate->_agg[aggIdx];

                string prodString = "";
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
                {
                    if (prod.test(f))
                    {
                        prodString += getFunctionString(f)+"*";
                    }
                }

                if (!prodString.empty())
                    prodString.pop_back();
                else
                    prodString += "1";
                
                sumString += prodString+"+";
                ++aggIdx;
            }
            sumString.pop_back();
            aggregateString += "SUM("+sumString+") AS agg_"+to_string(aggNum++)+",";
        }

        auto it_pair = fVarAggregateMap.insert({query->_fVars,""});
        it_pair.first->second += aggregateString;        
    }

    ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/aggregates_merged.sql", std::ofstream::out);

    size_t aggID = 0;
    for (auto& fvarAggPair : fVarAggregateMap)
    {
        string fVarString = "";
        
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (fvarAggPair.first[var])
                fVarString += _td->getAttribute(var)->_name + ",";
        }

        fvarAggPair.second.pop_back();
        
        ofs << "CREATE TABLE agg_"+to_string(aggID++)+" AS (\n" 
            "SELECT "+fVarString+fvarAggPair.second+"\nFROM "+joinString;
        if (!fVarString.empty())
        {
            fVarString.pop_back();
            ofs << "\nGROUP BY "+fVarString;
        }
        ofs << ");\n\n";
    }

    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregates.sql", std::ofstream::out);

    size_t aggID_unmerged = 0;
    for (size_t queryID = 0; queryID < _qc->numberOfQueries(); ++queryID)
    {
        Query* query = _qc->getQuery(queryID);

        string fVarString = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (query->_fVars[var])
                fVarString += _td->getAttribute(var)->_name + ",";
        }

        string aggregateString = "";
        for (size_t agg = 0; agg < query->_aggregates.size(); ++agg)
        {
            Aggregate* aggregate = query->_aggregates[agg];
            
            size_t aggIdx = 0;

            string sumString = "";
            for (size_t i = 0; i < aggregate->_agg.size(); i++)
            {
                const prod_bitset prod = aggregate->_agg[aggIdx];

                string prodString = "";
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
                {
                    if (prod.test(f) &&
                        _qc->getFunction(f)->_operation != Operation::dynamic)
                    {
                        prodString += getFunctionString(f)+"*";
                    }
                }

                if (!prodString.empty())
                    prodString.pop_back();
                else
                    prodString += "1";
                
                sumString += prodString+"+";
                ++aggIdx;
            }
            sumString.pop_back();

            aggregateString +="SUM("+sumString+") AS agg_"+to_string(agg)+",";
        }
        aggregateString.pop_back();
        
        std::string groupByString = "";
        if (!fVarString.empty())
        {
            aggregateString = fVarString+aggregateString;
            fVarString.pop_back();
            groupByString += "\nGROUP BY "+fVarString;
        }
        
        ofs << "CREATE TABLE agg_"+to_string(aggID_unmerged++)+" AS (\nSELECT "+
            aggregateString+"\nFROM "+joinString+groupByString+");\n\n";
    }

    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregate_merged_cleanup.sql", std::ofstream::out);
    for (size_t i = 0; i < aggID; ++i)
        ofs << "DROP TABLE IF EXISTS agg_"+to_string(i)+";\n";
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregate_cleanup.sql", std::ofstream::out);
    for (size_t i = 0; i < aggID_unmerged; ++i)
        ofs << "DROP TABLE IF EXISTS agg_"+to_string(i)+";\n";
    ofs.close();


}